

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_column_name(sqlite3_stmt *pStmt,int N)

{
  long lVar1;
  char *pcVar2;
  
  if ((uint)N < (uint)*(ushort *)(pStmt + 0xbc)) {
    lVar1 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
    pcVar2 = (char *)sqlite3ValueText((sqlite3_value *)
                                      ((ulong)(uint)N * 0x38 + *(long *)(pStmt + 0x80)),'\x01');
    if (*(char *)(lVar1 + 0x61) != '\0') {
      if (*(int *)(lVar1 + 0xc4) == 0) {
        *(undefined1 *)(lVar1 + 0x61) = 0;
        *(undefined4 *)(lVar1 + 0x158) = 0;
        *(int *)(lVar1 + 0x160) = *(int *)(lVar1 + 0x160) + -1;
      }
      pcVar2 = (char *)0x0;
    }
    if (*(sqlite3_mutex **)(lVar1 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 0x18));
    }
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

SQLITE_API const char *sqlite3_column_name(sqlite3_stmt *pStmt, int N){
  return columnName(
      pStmt, N, (const void*(*)(Mem*))sqlite3_value_text, COLNAME_NAME);
}